

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr0.c
# Opt level: O2

void append_states(void)

{
  int iVar1;
  Yshort *pYVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  iVar3 = nshifts;
  pYVar2 = shift_symbol;
  lVar4 = (long)nshifts;
  uVar5 = 1;
  do {
    if (lVar4 <= (long)uVar5) {
      for (lVar4 = 0; lVar4 < iVar3; lVar4 = lVar4 + 1) {
        iVar3 = get_state(shift_symbol[lVar4]);
        shiftset[lVar4] = iVar3;
        iVar3 = nshifts;
      }
      return;
    }
    iVar1 = pYVar2[uVar5];
    uVar7 = uVar5 & 0xffffffff;
    while (uVar6 = (uint)uVar7, 0 < (int)uVar6) {
      if (pYVar2[uVar7 - 1] <= iVar1) goto LAB_0010d598;
      pYVar2[uVar7] = pYVar2[uVar7 - 1];
      uVar7 = (ulong)(uVar6 - 1);
    }
    uVar6 = 0;
LAB_0010d598:
    pYVar2[uVar6] = iVar1;
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void append_states()
{
    register int i;
    register int j;
    register int symbol;

#ifdef	TRACE
    fprintf(stderr, "Entering append_states()\n");
#endif
    for (i = 1; i < nshifts; i++)
    {
	symbol = shift_symbol[i];
	j = i;
	while (j > 0 && shift_symbol[j - 1] > symbol)
	{
	    shift_symbol[j] = shift_symbol[j - 1];
	    j--;
	}
	shift_symbol[j] = symbol;
    }

    for (i = 0; i < nshifts; i++)
    {
	symbol = shift_symbol[i];
	shiftset[i] = get_state(symbol);
    }
}